

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1005.cpp
# Opt level: O0

int f(int i,int s1,int s2)

{
  int iVar1;
  int s1_00;
  int i_00;
  int *piVar2;
  reference pvVar3;
  int local_18;
  int local_14;
  int local_10;
  int s2_local;
  int s1_local;
  int i_local;
  
  local_14 = s2;
  local_10 = s1;
  s2_local = i;
  if (i == n) {
    local_18 = s1 - s2;
    if (local_18 < 1) {
      local_18 = -local_18;
    }
    piVar2 = std::min<int>(&min_,&local_18);
    min_ = *piVar2;
  }
  else {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&a,(long)i);
    f(i + 1,s1 + *pvVar3,local_14);
    s1_00 = local_10;
    iVar1 = local_14;
    i_00 = s2_local + 1;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&a,(long)s2_local);
    f(i_00,s1_00,iVar1 + *pvVar3);
  }
  return min_;
}

Assistant:

int f(int i, int s1, int s2) {
    if (i == n) {
        min_ = std::min(min_, abs(s1 - s2));
    } else {
        f(i + 1, s1 + a[i], s2);
        f(i + 1, s1, s2 + a[i]);
    }
    return min_;
}